

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerGLSL::pls_decl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,PlsRemap *var)

{
  PlsFormat PVar1;
  bool bVar2;
  SPIRVariable *pSVar3;
  Bitset *pBVar4;
  undefined4 uVar5;
  SPIRType type;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0 [2];
  undefined1 local_1b0 [16];
  char *local_1a0 [2];
  char local_190 [16];
  undefined **local_180;
  undefined4 local_178;
  undefined4 local_174;
  ulong local_170;
  undefined8 uStack_168;
  undefined1 *local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined1 local_148 [32];
  undefined1 *local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined1 local_110 [8];
  undefined4 local_108;
  undefined2 local_104;
  undefined4 local_100;
  undefined1 *local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined1 local_e0 [32];
  undefined1 *local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined1 local_a8 [32];
  undefined7 local_88;
  undefined4 uStack_81;
  undefined8 local_7c;
  undefined8 uStack_74;
  undefined4 local_6c;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  pSVar3 = Variant::get<spirv_cross::SPIRVariable>
                     ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                      var->id);
  PVar1 = var->format;
  if (PVar1 - PlsRGBA8I < 6) {
    local_170 = *(ulong *)(&DAT_0030af08 + (ulong)(PVar1 - PlsRGBA8I) * 8);
  }
  else {
    local_170 = 0xd00000016;
  }
  bVar2 = false;
  local_178 = 0;
  local_180 = &PTR__SPIRType_003a8f58;
  local_174 = (undefined4)local_170;
  uStack_168 = 0x100000001;
  uStack_158 = 0;
  local_150 = 8;
  uStack_120 = 0;
  local_118 = 8;
  local_108 = 0;
  local_104 = 0;
  local_100 = 8;
  uStack_f0 = 0;
  local_e8 = 8;
  uStack_b8 = 0;
  local_b0 = 8;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_88 = 0;
  uStack_81 = 0;
  local_6c = 0;
  local_7c = 0;
  uStack_74 = 0;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_170 = local_170 >> 0x20;
  uVar5 = 1;
  if (PVar1 < PlsR32UI) {
    if ((0x6b0U >> (PVar1 & 0x1f) & 1) == 0) {
      if ((0x948U >> (PVar1 & 0x1f) & 1) == 0) {
        if (PVar1 != PlsR11FG11FB10F) goto LAB_0025f7a0;
        uVar5 = 3;
      }
      else {
        uVar5 = 2;
      }
    }
    else {
      uVar5 = 4;
    }
    bVar2 = true;
  }
LAB_0025f7a0:
  if (bVar2) {
    local_174 = 0x17;
    uStack_168 = CONCAT44(1,uVar5);
  }
  if (PVar1 - PlsR11FG11FB10F < 0xc) {
    local_1c8 = &DAT_0030af38 + *(int *)(&DAT_0030af38 + (ulong)(PVar1 - PlsR11FG11FB10F) * 4);
  }
  else {
    local_1c8 = "";
  }
  local_160 = local_148;
  local_128 = local_110;
  local_f8 = local_e0;
  local_c0 = local_a8;
  pBVar4 = Compiler::get_decoration_bitset
                     (&this->super_Compiler,(ID)(pSVar3->super_IVariant).self.id);
  local_1d0 = "mediump ";
  if ((pBVar4->lower & 1) == 0) {
    local_1d0 = "highp ";
  }
  (*(this->super_Compiler)._vptr_Compiler[0x13])(local_1a0,this,&local_180,0);
  (*(this->super_Compiler)._vptr_Compiler[6])
            (local_1c0,this,(ulong)(pSVar3->super_IVariant).self.id,1);
  join<char_const*,char_const*,std::__cxx11::string,char_const(&)[2],std::__cxx11::string>
            (__return_storage_ptr__,(spirv_cross *)&local_1c8,&local_1d0,local_1a0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2f64a1,
             (char (*) [2])local_1c0,__return_storage_ptr__);
  if (local_1c0[0] != local_1b0) {
    operator_delete(local_1c0[0]);
  }
  if (local_1a0[0] != local_190) {
    operator_delete(local_1a0[0]);
  }
  local_180 = &PTR__SPIRType_003a8f58;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_68);
  uStack_b8 = 0;
  if (local_c0 != local_a8) {
    free(local_c0);
  }
  uStack_f0 = 0;
  if (local_f8 != local_e0) {
    free(local_f8);
  }
  uStack_120 = 0;
  if (local_128 != local_110) {
    free(local_128);
  }
  uStack_158 = 0;
  if (local_160 != local_148) {
    free(local_160);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::pls_decl(const PlsRemap &var)
{
	auto &variable = get<SPIRVariable>(var.id);

	auto op_and_basetype = pls_format_to_basetype(var.format);

	SPIRType type { op_and_basetype.first };
	type.basetype = op_and_basetype.second;
	auto vecsize = pls_format_to_components(var.format);
	if (vecsize > 1)
	{
		type.op = OpTypeVector;
		type.vecsize = vecsize;
	}

	return join(to_pls_layout(var.format), to_pls_qualifiers_glsl(variable), type_to_glsl(type), " ",
	            to_name(variable.self));
}